

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O2

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,IntrinsicType i,
          ArrayView<soul::Value> args,bool isFloat)

{
  int line;
  code *pcVar1;
  Value *pVVar2;
  int64_t iVar3;
  int64_t v;
  int64_t iVar4;
  undefined4 in_register_00000014;
  char *message;
  char cVar5;
  double dVar6;
  ArrayView<soul::Value> args_00;
  ArrayView<soul::Value> args_01;
  ArrayView<soul::Value> args_02;
  ArrayView<soul::Value> args_03;
  ArrayView<soul::Value> local_58;
  double local_48;
  double local_38;
  
  local_58.s = (Value *)CONCAT44(in_register_00000014,i);
  pVVar2 = args.e;
  local_58.e = args.s;
  cVar5 = (char)args.e;
  switch((ulong)this & 0xffffffff) {
  case 0:
    throwInternalCompilerError("perform",0x59);
  case 1:
    if (cVar5 == '\0') {
      if ((long)local_58.e - (long)local_58.s == 0x40) {
        pVVar2 = ArrayView<soul::Value>::front(&local_58);
        iVar4 = soul::Value::getAsInt64(pVVar2);
        v = -iVar4;
        if (0 < iVar4) {
          v = iVar4;
        }
LAB_0020bf7d:
        soul::Value::Value(__return_storage_ptr__,v);
        return __return_storage_ptr__;
      }
      message = "args.size() == 1";
      line = 0x22;
      goto LAB_0020bfb8;
    }
    pcVar1 = abs_d;
    break;
  case 2:
    if (cVar5 == '\0') {
      pcVar1 = min_i;
LAB_0020becf:
      args_03.e = (Value *)pcVar1;
      args_03.s = local_58.e;
      perform<long,long>(__return_storage_ptr__,(CompileTimeIntrinsicEvaluation *)local_58.s,args_03
                         ,(_func_long_long_long *)pVVar2);
      return __return_storage_ptr__;
    }
    pcVar1 = min_d;
    goto LAB_0020be46;
  case 3:
    if (cVar5 == '\0') {
      pcVar1 = max_i;
      goto LAB_0020becf;
    }
    pcVar1 = max_d;
    goto LAB_0020be46;
  case 4:
    if (cVar5 == '\0') {
      if ((long)local_58.e - (long)local_58.s == 0xc0) {
        pVVar2 = ArrayView<soul::Value>::operator[](&local_58,0);
        iVar3 = soul::Value::getAsInt64(pVVar2);
        pVVar2 = ArrayView<soul::Value>::operator[](&local_58,1);
        v = soul::Value::getAsInt64(pVVar2);
        pVVar2 = ArrayView<soul::Value>::operator[](&local_58,2);
        iVar4 = soul::Value::getAsInt64(pVVar2);
        if (iVar3 < iVar4) {
          iVar4 = iVar3;
        }
        if (v <= iVar3) {
          v = iVar4;
        }
        goto LAB_0020bf7d;
      }
    }
    else if ((long)local_58.e - (long)local_58.s == 0xc0) {
      pVVar2 = ArrayView<soul::Value>::operator[](&local_58,0);
      local_38 = soul::Value::getAsDouble(pVVar2);
      pVVar2 = ArrayView<soul::Value>::operator[](&local_58,1);
      local_48 = soul::Value::getAsDouble(pVVar2);
      pVVar2 = ArrayView<soul::Value>::operator[](&local_58,2);
      dVar6 = soul::Value::getAsDouble(pVVar2);
      if (local_38 <= dVar6) {
        dVar6 = local_38;
      }
      soul::Value::Value(__return_storage_ptr__,
                         (double)(-(ulong)(local_38 < local_48) & (ulong)local_48 |
                                 ~-(ulong)(local_38 < local_48) & (ulong)dVar6));
      return __return_storage_ptr__;
    }
    message = "args.size() == 3";
    line = 0x2e;
LAB_0020bfb8:
    throwInternalCompilerError(message,"perform",line);
  case 5:
    if (cVar5 == '\0') {
      pcVar1 = wrap_i;
      goto LAB_0020becf;
    }
    pcVar1 = wrap_d;
    goto LAB_0020be46;
  case 6:
    pcVar1 = fmod_d;
    goto LAB_0020be46;
  case 7:
    pcVar1 = remainder_d;
    goto LAB_0020be46;
  case 8:
    pcVar1 = floor_d;
    break;
  case 9:
    pcVar1 = ceil_d;
    break;
  case 10:
    pcVar1 = addModulo2Pi_d;
    goto LAB_0020be46;
  case 0xb:
    pcVar1 = sqrt_d;
    break;
  case 0xc:
    pcVar1 = pow_d;
    goto LAB_0020be46;
  case 0xd:
    pcVar1 = exp_d;
    break;
  case 0xe:
    pcVar1 = log_d;
    break;
  case 0xf:
    pcVar1 = log10_d;
    break;
  case 0x10:
    pcVar1 = sin_d;
    break;
  case 0x11:
    pcVar1 = cos_d;
    break;
  case 0x12:
    pcVar1 = tan_d;
    break;
  case 0x13:
    pcVar1 = sinh_d;
    break;
  case 0x14:
    pcVar1 = cosh_d;
    break;
  case 0x15:
    pcVar1 = tanh_d;
    break;
  case 0x16:
    pcVar1 = asinh_d;
    break;
  case 0x17:
    pcVar1 = acosh_d;
    break;
  case 0x18:
    pcVar1 = atanh_d;
    break;
  case 0x19:
    pcVar1 = asin_d;
    break;
  case 0x1a:
    pcVar1 = acos_d;
    break;
  case 0x1b:
    pcVar1 = atan_d;
    break;
  case 0x1c:
    pcVar1 = atan2_d;
LAB_0020be46:
    args_01.e = (Value *)pcVar1;
    args_01.s = local_58.e;
    perform<double,double>
              (__return_storage_ptr__,(CompileTimeIntrinsicEvaluation *)local_58.s,args_01,
               (_func_double_double_double *)pVVar2);
    return __return_storage_ptr__;
  case 0x1d:
    pcVar1 = isnan_d;
    goto LAB_0020bd3d;
  case 0x1e:
    pcVar1 = isinf_d;
LAB_0020bd3d:
    args_00.e = (Value *)pcVar1;
    args_00.s = local_58.e;
    perform<bool,double>
              (__return_storage_ptr__,(CompileTimeIntrinsicEvaluation *)local_58.s,args_00,
               (_func_bool_double *)pVVar2);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
    return __return_storage_ptr__;
  }
  args_02.e = (Value *)pcVar1;
  args_02.s = local_58.e;
  perform<double,double>
            (__return_storage_ptr__,(CompileTimeIntrinsicEvaluation *)local_58.s,args_02,
             (_func_double_double *)pVVar2);
  return __return_storage_ptr__;
}

Assistant:

Value perform (IntrinsicType i, ArrayView<Value> args, bool isFloat)
    {
        switch (i)
        {
            case IntrinsicType::none:                    SOUL_ASSERT_FALSE; break;
            case IntrinsicType::abs:                     return isFloat ? perform (args, abs_d)   : perform (args, abs_i);
            case IntrinsicType::min:                     return isFloat ? perform (args, min_d)   : perform (args, min_i);
            case IntrinsicType::max:                     return isFloat ? perform (args, max_d)   : perform (args, max_i);
            case IntrinsicType::clamp:                   return isFloat ? perform (args, clamp_d) : perform (args, clamp_i);
            case IntrinsicType::wrap:                    return isFloat ? perform (args, wrap_d)  : perform (args, wrap_i);
            case IntrinsicType::fmod:                    return perform (args, fmod_d);
            case IntrinsicType::remainder:               return perform (args, remainder_d);
            case IntrinsicType::floor:                   return perform (args, floor_d);
            case IntrinsicType::ceil:                    return perform (args, ceil_d);
            case IntrinsicType::addModulo2Pi:            return perform (args, addModulo2Pi_d);
            case IntrinsicType::sqrt:                    return perform (args, sqrt_d);
            case IntrinsicType::pow:                     return perform (args, pow_d);
            case IntrinsicType::exp:                     return perform (args, exp_d);
            case IntrinsicType::log:                     return perform (args, log_d);
            case IntrinsicType::log10:                   return perform (args, log10_d);
            case IntrinsicType::sin:                     return perform (args, sin_d);
            case IntrinsicType::cos:                     return perform (args, cos_d);
            case IntrinsicType::tan:                     return perform (args, tan_d);
            case IntrinsicType::sinh:                    return perform (args, sinh_d);
            case IntrinsicType::cosh:                    return perform (args, cosh_d);
            case IntrinsicType::tanh:                    return perform (args, tanh_d);
            case IntrinsicType::asinh:                   return perform (args, asinh_d);
            case IntrinsicType::acosh:                   return perform (args, acosh_d);
            case IntrinsicType::atanh:                   return perform (args, atanh_d);
            case IntrinsicType::asin:                    return perform (args, asin_d);
            case IntrinsicType::acos:                    return perform (args, acos_d);
            case IntrinsicType::atan:                    return perform (args, atan_d);
            case IntrinsicType::atan2:                   return perform (args, atan2_d);
            case IntrinsicType::isnan:                   return perform (args, isnan_d);
            case IntrinsicType::isinf:                   return perform (args, isinf_d);
            case IntrinsicType::roundToInt:              return {};
            case IntrinsicType::sum:                     return {};
            case IntrinsicType::product:                 return {};
            case IntrinsicType::get_array_size:          return {};
            case IntrinsicType::read:                    return {};
            case IntrinsicType::readLinearInterpolated:  return {};
        }

        return {};
    }